

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::changeRhs
          (SPxSolverBase<double> *this,VectorBase<double> *newRhs,bool scale)

{
  int i;
  ulong uVar1;
  
  this->m_nonbasicValue = 0.0;
  this->m_nonbasicValueUpToDate = false;
  SPxLPBase<double>::changeRhs(&this->super_SPxLPBase<double>,newRhs,scale);
  if (NO_PROBLEM < (this->super_SPxBasisBase<double>).thestatus) {
    for (uVar1 = 0;
        (long)uVar1 <
        (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set
              .thenum; uVar1 = uVar1 + 1) {
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6c])
                ((this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar1],0,this,uVar1 & 0xffffffff);
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
    return;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeRhs(const VectorBase<R>& newRhs, bool scale)
{
   // we better recompute the nonbasic value when changing all rhs
   forceRecompNonbasicValue();

   SPxLPBase<R>::changeRhs(newRhs, scale);

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      for(int i = 0; i < this->nRows(); ++i)
         changeRhsStatus(i, this->rhs(i));

      unInit();
   }
}